

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

VOID CorUnix::TerminateCurrentProcessNoExit(BOOL bTerminateUnconditionally)

{
  Volatile<int> VVar1;
  Volatile<int> VVar2;
  DWORD DVar3;
  BOOL BVar4;
  bool bVar5;
  
  VVar1.m_val = GetCurrentThreadId();
  VVar2.m_val = 0;
  LOCK();
  bVar5 = terminator.m_val != 0;
  if (bVar5) {
    VVar2 = terminator;
    VVar1 = terminator;
  }
  terminator.m_val = VVar1.m_val;
  UNLOCK();
  if ((bVar5) && (DVar3 = GetCurrentThreadId(), DVar3 != VVar2.m_val)) {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    poll((pollfd *)0x0,0,-1);
  }
  BVar4 = PALInitLock();
  if ((BVar4 != 0) && (0 < init_count.m_val)) {
    PALSetShutdownIntent();
    PALCommonCleanup();
    PALShutdown();
    return;
  }
  return;
}

Assistant:

VOID
CorUnix::TerminateCurrentProcessNoExit(BOOL bTerminateUnconditionally)
{
    BOOL locked;
    DWORD old_terminator;

    old_terminator = InterlockedCompareExchange(&terminator, GetCurrentThreadId(), 0);

    if (0 != old_terminator && GetCurrentThreadId() != old_terminator)
    {
        /* another thread has already initiated the termination process. we
           could just block on the PALInitLock critical section, but then
           PROCSuspendOtherThreads would hang... so sleep forever here, we're
           terminating anyway

           Update: [TODO] PROCSuspendOtherThreads has been removed. Can this
           code be changed? */

        /* note that if *this* thread has already started the termination
           process, we want to proceed. the only way this can happen is if a
           call to DllMain (from ExitProcess) brought us here (because DllMain
           called ExitProcess, or TerminateProcess, or ExitThread);
           TerminateProcess won't call DllMain, so there's no danger to get
           caught in an infinite loop */
        WARN("termination already started from another thread; blocking.\n");
        poll(NULL, 0, INFTIM);
    }

    /* Try to lock the initialization count to prevent multiple threads from
       terminating/initializing the PAL simultaneously */

    /* note : it's also important to take this lock before the process lock,
       because Init/Shutdown take the init lock, and the functions they call
       may take the process lock. We must do it in the same order to avoid
       deadlocks */
    locked = PALInitLock();
    if(locked && PALIsInitialized())
    {
         PROCCleanupProcess(bTerminateUnconditionally);
     }
}